

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void matrix_mult(vector *out,matrix *m,vector *a)

{
  undefined1 local_228 [8];
  scalar product;
  int j;
  int i;
  vector *a_local;
  matrix *m_local;
  vector *out_local;
  
  vector_zero(out);
  product.c[0xfe] = 0;
  product.c[0xff] = 0;
  for (; (int)product.c._508_4_ < 3; product.c._508_4_ = product.c._508_4_ + 1) {
    product.c[0xfc] = 0;
    product.c[0xfd] = 0;
    for (; (int)product.c._504_4_ < 3; product.c._504_4_ = product.c._504_4_ + 1) {
      scalar_mult((scalar *)local_228,m->v[(int)product.c._508_4_] + (int)product.c._504_4_,
                  a->v + (int)product.c._504_4_);
      scalar_add(out->v + (int)product.c._508_4_,(scalar *)local_228);
    }
  }
  return;
}

Assistant:

static void matrix_mult(vector *out, const matrix *m, const vector *a) {
  vector_zero(out);
  for (int i = 0; i < RANK; i++) {
    for (int j = 0; j < RANK; j++) {
      scalar product;
      scalar_mult(&product, &m->v[i][j], &a->v[j]);
      scalar_add(&out->v[i], &product);
    }
  }
}